

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_mul(m2v *A,m2v *B,m2v *AB_out)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  iVar5 = AB_out->n_row;
  if (0 < iVar5) {
    iVar3 = AB_out->n_col;
    iVar10 = 0;
    do {
      if (0 < iVar3) {
        uVar1 = 0;
        do {
          if ((long)A->n_col < 1) {
            iVar5 = AB_out->row_stride * iVar10 + ((uint)(uVar1 >> 5) & 0x7ffffff);
            uVar8 = 1 << ((byte)uVar1 & 0x1f);
LAB_00101dfa:
            AB_out->e[iVar5] = AB_out->e[iVar5] & ~uVar8;
          }
          else {
            puVar4 = (uint *)((uVar1 >> 3 & 0xfffffffffffffffc) + (long)B->e);
            bVar2 = (byte)uVar1 & 0x1f;
            uVar6 = 0;
            uVar8 = 0;
            do {
              uVar7 = uVar8;
              uVar9 = *puVar4 >> bVar2 &
                      A->e[(int)(((uint)(uVar6 >> 5) & 0x7ffffff) + A->row_stride * iVar10)] >>
                      ((byte)uVar6 & 0x1f) & 1;
              uVar6 = uVar6 + 1;
              puVar4 = puVar4 + B->row_stride;
              uVar8 = uVar9 ^ uVar7;
            } while ((long)A->n_col != uVar6);
            iVar5 = AB_out->row_stride * iVar10 + ((uint)(uVar1 >> 5) & 0x7ffffff);
            uVar8 = 1 << bVar2;
            if (uVar9 == uVar7) goto LAB_00101dfa;
            AB_out->e[iVar5] = AB_out->e[iVar5] | uVar8;
          }
          uVar1 = uVar1 + 1;
          iVar3 = AB_out->n_col;
        } while ((int)uVar1 < iVar3);
        iVar5 = AB_out->n_row;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar5);
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}